

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.H
# Opt level: O2

void __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_>::~IndexSpaceImp
          (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,_int>_> *this)

{
  ~IndexSpaceImp(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

virtual ~IndexSpaceImp () {}